

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::PipelineStateVkImpl::DvpValidateResourceLimits(PipelineStateVkImpl *this)

{
  value_type_conflict vVar1;
  value_type_conflict vVar2;
  value_type_conflict vVar3;
  undefined *puVar4;
  uint uVar5;
  PIPELINE_RESOURCE_FLAGS PVar6;
  DescriptorType DVar7;
  Uint32 UVar8;
  type ShaderType_00;
  RenderDeviceVkImpl *pRVar9;
  VulkanPhysicalDevice *pVVar10;
  VkPhysicalDeviceProperties *pVVar11;
  ExtensionProperties *pEVar12;
  ExtensionFeatures *pEVar13;
  ExtensionProperties *pEVar14;
  reference pvVar15;
  reference this_00;
  reference pvVar16;
  Char *pCVar17;
  PipelineResourceSignatureDesc *pPVar18;
  undefined8 uVar19;
  ulong uVar20;
  size_type sVar21;
  const_reference pvVar22;
  char (*in_stack_fffffffffffff9b8) [124];
  string *in_stack_fffffffffffff9c8;
  undefined1 local_528 [8];
  string msg_17;
  string msg_16;
  string msg_15;
  string msg_14;
  string msg_13;
  string msg_12;
  string msg_11;
  string msg_10;
  Uint32 NumResources;
  Uint32 NumAccelerationStructures_1;
  Uint32 NumInputAttachments_1;
  Uint32 NumSamplers_1;
  Uint32 NumUniformBuffers_1;
  Uint32 NumStorageBuffers_1;
  Uint32 NumStorageImages_1;
  Uint32 NumSampledImages_1;
  char *StageName;
  reference pvStack_3f8;
  SHADER_TYPE ShaderType;
  array<unsigned_int,_16UL> *NumDesc;
  undefined1 local_3e8 [4];
  Uint32 ShaderInd_1;
  string msg_9;
  string msg_8;
  string msg_7;
  string msg_6;
  string msg_5;
  string msg_4;
  string msg_3;
  string msg_2;
  string msg_1;
  value_type_conflict local_2c0;
  Uint32 NumAccelerationStructures;
  Uint32 NumInputAttachments;
  Uint32 NumDynamicUniformBuffers;
  Uint32 NumUniformBuffers;
  Uint32 NumSamplers;
  Uint32 NumDynamicStorageBuffers;
  Uint32 NumStorageBuffers;
  Uint32 NumStorageImages;
  Uint32 NumSampledImages;
  string _msg_1;
  string _msg;
  undefined1 local_250 [8];
  string msg;
  bool NonUniformIndexingIsNative;
  SHADER_TYPE SStack_228;
  bool NonUniformIndexingSupported;
  Int32 ShaderInd;
  SHADER_TYPE ShaderStages;
  Uint32 DescIndex;
  ResourceAttribs *ResAttr;
  PipelineResourceDesc *ResDesc;
  PipelineResourceSignatureVkImpl *pPStack_208;
  Uint32 r;
  PipelineResourceSignatureVkImpl *pSignature;
  Uint32 s;
  undefined1 local_1f4 [2];
  array<bool,_6UL> ShaderStagePresented;
  array<std::array<unsigned_int,_16UL>,_6UL> PerStageDescriptorCount;
  array<unsigned_int,_16UL> DescriptorCount;
  Uint32 DescCount;
  VkPhysicalDeviceDescriptorIndexingPropertiesEXT *DescIndProps;
  VkPhysicalDeviceDescriptorIndexingFeaturesEXT *DescIndFeats;
  VkPhysicalDeviceAccelerationStructurePropertiesKHR *ASLimits;
  VkPhysicalDeviceLimits *Limits;
  PipelineStateVkImpl *this_local;
  
  pRVar9 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                        *)this);
  pVVar10 = RenderDeviceVkImpl::GetPhysicalDevice(pRVar9);
  pVVar11 = VulkanUtilities::VulkanPhysicalDevice::GetProperties(pVVar10);
  pRVar9 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                        *)this);
  pVVar10 = RenderDeviceVkImpl::GetPhysicalDevice(pRVar9);
  pEVar12 = VulkanUtilities::VulkanPhysicalDevice::GetExtProperties(pVVar10);
  pRVar9 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                        *)this);
  pVVar10 = RenderDeviceVkImpl::GetPhysicalDevice(pRVar9);
  pEVar13 = VulkanUtilities::VulkanPhysicalDevice::GetExtFeatures(pVVar10);
  pRVar9 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                        *)this);
  pVVar10 = RenderDeviceVkImpl::GetPhysicalDevice(pRVar9);
  pEVar14 = VulkanUtilities::VulkanPhysicalDevice::GetExtProperties(pVVar10);
  memset(PerStageDescriptorCount._M_elems[5]._M_elems + 0xe,0,0x40);
  memset(local_1f4,0,0x180);
  memset((void *)((long)&pSignature + 6),0,6);
  for (pSignature._0_4_ = 0;
      (uint)pSignature <
      (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_SignatureCount;
      pSignature._0_4_ = (uint)pSignature + 1) {
    pPStack_208 = Diligent::RefCntAutoPtr::operator_cast_to_PipelineResourceSignatureVkImpl_
                            ((RefCntAutoPtr *)
                             ((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                              m_Signatures + (uint)pSignature));
    if (pPStack_208 != (PipelineResourceSignatureVkImpl *)0x0) {
      for (ResDesc._4_4_ = 0; uVar5 = ResDesc._4_4_,
          UVar8 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetTotalResourceCount
                            (&pPStack_208->
                              super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>),
          uVar5 < UVar8; ResDesc._4_4_ = ResDesc._4_4_ + 1) {
        ResAttr = (ResourceAttribs *)
                  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                            (&pPStack_208->
                              super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                             ResDesc._4_4_);
        _ShaderStages =
             PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                       (&pPStack_208->
                         super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                        ResDesc._4_4_);
        ShaderInd = (uint)((ulong)*(undefined8 *)_ShaderStages >> 0x39) & 0x1f;
        uVar19 = *(undefined8 *)_ShaderStages;
        pvVar15 = std::array<unsigned_int,_16UL>::operator[]
                            ((array<unsigned_int,_16UL> *)
                             (PerStageDescriptorCount._M_elems[5]._M_elems + 0xe),
                             (ulong)(uint)ShaderInd);
        *pvVar15 = ((uint)((ulong)uVar19 >> 0x20) & 0x1ffffff) + *pvVar15;
        SStack_228 = ResAttr->SRBCacheOffset;
        while (SStack_228 != SHADER_TYPE_UNKNOWN) {
          ShaderType_00 = ExtractLSB<Diligent::SHADER_TYPE>(&stack0xfffffffffffffdd8);
          msg.field_2._12_4_ =
               GetShaderTypePipelineIndex
                         (ShaderType_00,
                          (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                          .m_Desc.PipelineType);
          uVar19 = *(undefined8 *)_ShaderStages;
          this_00 = std::array<std::array<unsigned_int,_16UL>,_6UL>::operator[]
                              ((array<std::array<unsigned_int,_16UL>,_6UL> *)local_1f4,
                               (long)(int)msg.field_2._12_4_);
          pvVar15 = std::array<unsigned_int,_16UL>::operator[](this_00,(ulong)(uint)ShaderInd);
          *pvVar15 = ((uint)((ulong)uVar19 >> 0x20) & 0x1ffffff) + *pvVar15;
          pvVar16 = std::array<bool,_6UL>::operator[]
                              ((array<bool,_6UL> *)((long)&pSignature + 6),
                               (long)(int)msg.field_2._12_4_);
          *pvVar16 = true;
        }
        PVar6 = Diligent::operator&(ResAttr[1].field_0x2,PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY);
        if (PVar6 != PIPELINE_RESOURCE_FLAG_NONE) {
          msg.field_2._M_local_buf[0xb] = '\0';
          msg.field_2._M_local_buf[10] = '\0';
          DVar7 = PipelineResourceAttribsVk::GetDescriptorType(_ShaderStages);
          switch(DVar7) {
          case Sampler:
            msg.field_2._M_local_buf[0xb] = '\x01';
            msg.field_2._M_local_buf[10] = '\x01';
            break;
          case CombinedImageSampler:
          case SeparateImage:
            msg.field_2._M_local_buf[0xb] =
                 (pEVar13->DescriptorIndexing).shaderSampledImageArrayNonUniformIndexing != 0;
            msg.field_2._M_local_buf[10] =
                 (pEVar14->DescriptorIndexing).shaderSampledImageArrayNonUniformIndexingNative != 0;
            break;
          case StorageImage:
            msg.field_2._M_local_buf[0xb] =
                 (pEVar13->DescriptorIndexing).shaderStorageImageArrayNonUniformIndexing != 0;
            msg.field_2._M_local_buf[10] =
                 (pEVar14->DescriptorIndexing).shaderStorageImageArrayNonUniformIndexingNative != 0;
            break;
          case UniformTexelBuffer:
            msg.field_2._M_local_buf[0xb] =
                 (pEVar13->DescriptorIndexing).shaderUniformTexelBufferArrayNonUniformIndexing != 0;
            msg.field_2._M_local_buf[10] =
                 (pEVar14->DescriptorIndexing).shaderSampledImageArrayNonUniformIndexingNative != 0;
            break;
          case StorageTexelBuffer:
          case StorageTexelBuffer_ReadOnly:
            msg.field_2._M_local_buf[0xb] =
                 (pEVar13->DescriptorIndexing).shaderStorageTexelBufferArrayNonUniformIndexing != 0;
            msg.field_2._M_local_buf[10] =
                 (pEVar14->DescriptorIndexing).shaderStorageBufferArrayNonUniformIndexingNative != 0
            ;
            break;
          case UniformBuffer:
          case UniformBufferDynamic:
            msg.field_2._M_local_buf[0xb] =
                 (pEVar13->DescriptorIndexing).shaderUniformBufferArrayNonUniformIndexing != 0;
            msg.field_2._M_local_buf[10] =
                 (pEVar14->DescriptorIndexing).shaderUniformBufferArrayNonUniformIndexingNative != 0
            ;
            break;
          case StorageBuffer:
          case StorageBuffer_ReadOnly:
          case StorageBufferDynamic:
          case StorageBufferDynamic_ReadOnly:
            msg.field_2._M_local_buf[0xb] =
                 (pEVar13->DescriptorIndexing).shaderStorageBufferArrayNonUniformIndexing != 0;
            msg.field_2._M_local_buf[10] =
                 (pEVar14->DescriptorIndexing).shaderStorageBufferArrayNonUniformIndexingNative != 0
            ;
            break;
          case InputAttachment:
            msg.field_2._M_local_buf[0xb] =
                 (pEVar13->DescriptorIndexing).shaderInputAttachmentArrayNonUniformIndexing != 0;
            msg.field_2._M_local_buf[10] =
                 (pEVar14->DescriptorIndexing).shaderInputAttachmentArrayNonUniformIndexingNative !=
                 0;
            break;
          default:
            FormatString<char[27]>((string *)local_250,(char (*) [27])"Unexpected descriptor type");
            pCVar17 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar17,"DvpValidateResourceLimits",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                       ,0x41e);
            std::__cxx11::string::~string((string *)local_250);
            break;
          case AccelerationStructure:
            msg.field_2._M_local_buf[0xb] = '\x01';
            msg.field_2._M_local_buf[10] = '\x01';
          }
          if ((msg.field_2._M_local_buf[0xb] & 1U) == 0) {
            pPVar18 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                      ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                 *)pPStack_208);
            FormatString<char[6],char_const*,char[24],char_const*,char[29],char_const*,char[124]>
                      ((string *)((long)&_msg_1.field_2 + 8),(Diligent *)0xe52327,
                       (char (*) [6])
                       &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                        .m_Desc,(char **)"\', resource signature \'",(char (*) [24])pPVar18,
                       (char **)"\' contains shader resource \'",(char (*) [29])ResAttr,
                       (char **)
                       "\' that is defined with RUNTIME_ARRAY flag, but current device does not support non-uniform indexing for this resource type."
                       ,in_stack_fffffffffffff9b8);
            puVar4 = DebugMessageCallback;
            if (DebugMessageCallback != (undefined *)0x0) {
              uVar19 = std::__cxx11::string::c_str();
              (*(code *)puVar4)(1,uVar19,0);
            }
            std::__cxx11::string::~string((string *)(_msg_1.field_2._M_local_buf + 8));
          }
          else if ((msg.field_2._M_local_buf[10] & 1U) == 0) {
            pPVar18 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                      ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                 *)pPStack_208);
            FormatString<char[29],char_const*,char[24],char_const*,char[21],char_const*,char[91]>
                      ((string *)&NumStorageImages,(Diligent *)"Performance warning in PSO \'",
                       (char (*) [29])
                       &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                        .m_Desc,(char **)"\', resource signature \'",(char (*) [24])pPVar18,
                       (char **)"\': shader resource \'",(char (*) [21])ResAttr,
                       (char **)
                       "\' is defined with RUNTIME_ARRAY flag, but non-uniform indexing is emulated on this device."
                       ,(char (*) [91])in_stack_fffffffffffff9b8);
            puVar4 = DebugMessageCallback;
            if (DebugMessageCallback != (undefined *)0x0) {
              uVar19 = std::__cxx11::string::c_str();
              (*(code *)puVar4)(1,uVar19,0);
            }
            std::__cxx11::string::~string((string *)&NumStorageImages);
          }
        }
      }
    }
  }
  pvVar15 = std::array<unsigned_int,_16UL>::operator[]
                      ((array<unsigned_int,_16UL> *)
                       (PerStageDescriptorCount._M_elems[5]._M_elems + 0xe),1);
  vVar1 = *pvVar15;
  pvVar15 = std::array<unsigned_int,_16UL>::operator[]
                      ((array<unsigned_int,_16UL> *)
                       (PerStageDescriptorCount._M_elems[5]._M_elems + 0xe),2);
  vVar2 = *pvVar15;
  pvVar15 = std::array<unsigned_int,_16UL>::operator[]
                      ((array<unsigned_int,_16UL> *)
                       (PerStageDescriptorCount._M_elems[5]._M_elems + 0xe),4);
  NumStorageBuffers = vVar1 + vVar2 + *pvVar15;
  pvVar15 = std::array<unsigned_int,_16UL>::operator[]
                      ((array<unsigned_int,_16UL> *)
                       (PerStageDescriptorCount._M_elems[5]._M_elems + 0xe),3);
  vVar1 = *pvVar15;
  pvVar15 = std::array<unsigned_int,_16UL>::operator[]
                      ((array<unsigned_int,_16UL> *)
                       (PerStageDescriptorCount._M_elems[5]._M_elems + 0xe),5);
  vVar2 = *pvVar15;
  pvVar15 = std::array<unsigned_int,_16UL>::operator[]
                      ((array<unsigned_int,_16UL> *)
                       (PerStageDescriptorCount._M_elems[5]._M_elems + 0xe),6);
  NumDynamicStorageBuffers = vVar1 + vVar2 + *pvVar15;
  pvVar15 = std::array<unsigned_int,_16UL>::operator[]
                      ((array<unsigned_int,_16UL> *)
                       (PerStageDescriptorCount._M_elems[5]._M_elems + 0xe),9);
  vVar1 = *pvVar15;
  pvVar15 = std::array<unsigned_int,_16UL>::operator[]
                      ((array<unsigned_int,_16UL> *)
                       (PerStageDescriptorCount._M_elems[5]._M_elems + 0xe),10);
  NumSamplers = vVar1 + *pvVar15;
  pvVar15 = std::array<unsigned_int,_16UL>::operator[]
                      ((array<unsigned_int,_16UL> *)
                       (PerStageDescriptorCount._M_elems[5]._M_elems + 0xe),0xb);
  vVar1 = *pvVar15;
  pvVar15 = std::array<unsigned_int,_16UL>::operator[]
                      ((array<unsigned_int,_16UL> *)
                       (PerStageDescriptorCount._M_elems[5]._M_elems + 0xe),0xc);
  NumUniformBuffers = vVar1 + *pvVar15;
  pvVar15 = std::array<unsigned_int,_16UL>::operator[]
                      ((array<unsigned_int,_16UL> *)
                       (PerStageDescriptorCount._M_elems[5]._M_elems + 0xe),0);
  NumDynamicUniformBuffers = *pvVar15;
  pvVar15 = std::array<unsigned_int,_16UL>::operator[]
                      ((array<unsigned_int,_16UL> *)
                       (PerStageDescriptorCount._M_elems[5]._M_elems + 0xe),7);
  NumInputAttachments = *pvVar15;
  pvVar15 = std::array<unsigned_int,_16UL>::operator[]
                      ((array<unsigned_int,_16UL> *)
                       (PerStageDescriptorCount._M_elems[5]._M_elems + 0xe),8);
  NumAccelerationStructures = *pvVar15;
  pvVar15 = std::array<unsigned_int,_16UL>::operator[]
                      ((array<unsigned_int,_16UL> *)
                       (PerStageDescriptorCount._M_elems[5]._M_elems + 0xe),0xd);
  local_2c0 = *pvVar15;
  pvVar15 = std::array<unsigned_int,_16UL>::operator[]
                      ((array<unsigned_int,_16UL> *)
                       (PerStageDescriptorCount._M_elems[5]._M_elems + 0xe),0xf);
  msg_1.field_2._12_4_ = *pvVar15;
  if ((pVVar11->limits).maxDescriptorSetSamplers < NumDynamicUniformBuffers) {
    FormatString<char[9],char_const*,char[28],unsigned_int,char[22],unsigned_int,char[3]>
              ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of samplers (",
               (char (*) [28])&NumDynamicUniformBuffers,(uint *)") exceeds the limit (",
               (char (*) [22])&(pVVar11->limits).maxDescriptorSetSamplers,(uint *)0xf65ced,
               (char (*) [3])in_stack_fffffffffffff9b8);
    pCVar17 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar17,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x447);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if ((pVVar11->limits).maxDescriptorSetSampledImages < NumStorageBuffers) {
    FormatString<char[9],char_const*,char[34],unsigned_int,char[22],unsigned_int,char[3]>
              ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of sampled images (",
               (char (*) [34])&NumStorageBuffers,(uint *)") exceeds the limit (",
               (char (*) [22])&(pVVar11->limits).maxDescriptorSetSampledImages,(uint *)0xf65ced,
               (char (*) [3])in_stack_fffffffffffff9b8);
    pCVar17 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar17,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x449);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
  }
  if ((pVVar11->limits).maxDescriptorSetStorageImages < NumDynamicStorageBuffers) {
    FormatString<char[9],char_const*,char[34],unsigned_int,char[22],unsigned_int,char[3]>
              ((string *)((long)&msg_4.field_2 + 8),(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of storage images (",
               (char (*) [34])&NumDynamicStorageBuffers,(uint *)") exceeds the limit (",
               (char (*) [22])&(pVVar11->limits).maxDescriptorSetStorageImages,(uint *)0xf65ced,
               (char (*) [3])in_stack_fffffffffffff9b8);
    pCVar17 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar17,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,1099);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  if ((pVVar11->limits).maxDescriptorSetStorageBuffers < NumSamplers) {
    FormatString<char[9],char_const*,char[35],unsigned_int,char[22],unsigned_int,char[3]>
              ((string *)((long)&msg_5.field_2 + 8),(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of storage buffers (",(char (*) [35])&NumSamplers,
               (uint *)") exceeds the limit (",
               (char (*) [22])&(pVVar11->limits).maxDescriptorSetStorageBuffers,(uint *)0xf65ced,
               (char (*) [3])in_stack_fffffffffffff9b8);
    pCVar17 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar17,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x44d);
    std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
  }
  if ((pVVar11->limits).maxDescriptorSetStorageBuffersDynamic < NumUniformBuffers) {
    FormatString<char[9],char_const*,char[43],unsigned_int,char[22],unsigned_int,char[3]>
              ((string *)((long)&msg_6.field_2 + 8),(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of dynamic storage buffers (",
               (char (*) [43])&NumUniformBuffers,(uint *)") exceeds the limit (",
               (char (*) [22])&(pVVar11->limits).maxDescriptorSetStorageBuffersDynamic,
               (uint *)0xf65ced,(char (*) [3])in_stack_fffffffffffff9b8);
    pCVar17 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar17,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x44f);
    std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
  }
  if ((pVVar11->limits).maxDescriptorSetUniformBuffers < NumInputAttachments) {
    FormatString<char[9],char_const*,char[35],unsigned_int,char[22],unsigned_int,char[3]>
              ((string *)((long)&msg_7.field_2 + 8),(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of uniform buffers (",
               (char (*) [35])&NumInputAttachments,(uint *)") exceeds the limit (",
               (char (*) [22])&(pVVar11->limits).maxDescriptorSetUniformBuffers,(uint *)0xf65ced,
               (char (*) [3])in_stack_fffffffffffff9b8);
    pCVar17 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar17,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x451);
    std::__cxx11::string::~string((string *)(msg_7.field_2._M_local_buf + 8));
  }
  if ((pVVar11->limits).maxDescriptorSetUniformBuffersDynamic < NumAccelerationStructures) {
    FormatString<char[9],char_const*,char[43],unsigned_int,char[22],unsigned_int,char[3]>
              ((string *)((long)&msg_8.field_2 + 8),(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of dynamic uniform buffers (",
               (char (*) [43])&NumAccelerationStructures,(uint *)") exceeds the limit (",
               (char (*) [22])&(pVVar11->limits).maxDescriptorSetUniformBuffersDynamic,
               (uint *)0xf65ced,(char (*) [3])in_stack_fffffffffffff9b8);
    pCVar17 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar17,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x453);
    std::__cxx11::string::~string((string *)(msg_8.field_2._M_local_buf + 8));
  }
  if ((pVVar11->limits).maxDescriptorSetInputAttachments < local_2c0) {
    FormatString<char[9],char_const*,char[37],unsigned_int,char[22],unsigned_int,char[3]>
              ((string *)((long)&msg_9.field_2 + 8),(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of input attachments (",(char (*) [37])&local_2c0,
               (uint *)") exceeds the limit (",
               (char (*) [22])&(pVVar11->limits).maxDescriptorSetInputAttachments,(uint *)0xf65ced,
               (char (*) [3])in_stack_fffffffffffff9b8);
    pCVar17 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar17,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x455);
    std::__cxx11::string::~string((string *)(msg_9.field_2._M_local_buf + 8));
  }
  if ((pEVar12->AccelStruct).maxDescriptorSetAccelerationStructures < (uint)msg_1.field_2._12_4_) {
    FormatString<char[9],char_const*,char[43],unsigned_int,char[22],unsigned_int,char[3]>
              ((string *)local_3e8,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of acceleration structures (",
               (char (*) [43])((long)&msg_1.field_2 + 0xc),(uint *)") exceeds the limit (",
               (char (*) [22])&(pEVar12->AccelStruct).maxDescriptorSetAccelerationStructures,
               (uint *)0xf65ced,(char (*) [3])in_stack_fffffffffffff9b8);
    pCVar17 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar17,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x457);
    std::__cxx11::string::~string((string *)local_3e8);
  }
  for (NumDesc._4_4_ = 0; uVar20 = (ulong)NumDesc._4_4_,
      sVar21 = std::array<std::array<unsigned_int,_16UL>,_6UL>::size
                         ((array<std::array<unsigned_int,_16UL>,_6UL> *)local_1f4), uVar20 < sVar21;
      NumDesc._4_4_ = NumDesc._4_4_ + 1) {
    pvVar16 = std::array<bool,_6UL>::operator[]
                        ((array<bool,_6UL> *)((long)&pSignature + 6),(ulong)NumDesc._4_4_);
    if ((*pvVar16 & 1U) != 0) {
      pvStack_3f8 = std::array<std::array<unsigned_int,_16UL>,_6UL>::operator[]
                              ((array<std::array<unsigned_int,_16UL>,_6UL> *)local_1f4,
                               (ulong)NumDesc._4_4_);
      StageName._4_4_ =
           GetShaderTypeFromPipelineIndex
                     (NumDesc._4_4_,
                      (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                      .m_Desc.PipelineType);
      _NumStorageImages_1 = GetShaderTypeLiteralName(StageName._4_4_);
      pvVar22 = std::array<unsigned_int,_16UL>::operator[](pvStack_3f8,1);
      vVar1 = *pvVar22;
      pvVar22 = std::array<unsigned_int,_16UL>::operator[](pvStack_3f8,2);
      vVar2 = *pvVar22;
      pvVar22 = std::array<unsigned_int,_16UL>::operator[](pvStack_3f8,4);
      NumStorageBuffers_1 = vVar1 + vVar2 + *pvVar22;
      pvVar22 = std::array<unsigned_int,_16UL>::operator[](pvStack_3f8,3);
      vVar1 = *pvVar22;
      pvVar22 = std::array<unsigned_int,_16UL>::operator[](pvStack_3f8,5);
      vVar2 = *pvVar22;
      pvVar22 = std::array<unsigned_int,_16UL>::operator[](pvStack_3f8,6);
      NumUniformBuffers_1 = vVar1 + vVar2 + *pvVar22;
      pvVar22 = std::array<unsigned_int,_16UL>::operator[](pvStack_3f8,9);
      vVar1 = *pvVar22;
      pvVar22 = std::array<unsigned_int,_16UL>::operator[](pvStack_3f8,10);
      vVar2 = *pvVar22;
      pvVar22 = std::array<unsigned_int,_16UL>::operator[](pvStack_3f8,0xb);
      vVar3 = *pvVar22;
      pvVar22 = std::array<unsigned_int,_16UL>::operator[](pvStack_3f8,0xc);
      NumSamplers_1 = vVar1 + vVar2 + vVar3 + *pvVar22;
      pvVar22 = std::array<unsigned_int,_16UL>::operator[](pvStack_3f8,7);
      vVar1 = *pvVar22;
      pvVar22 = std::array<unsigned_int,_16UL>::operator[](pvStack_3f8,8);
      NumInputAttachments_1 = vVar1 + *pvVar22;
      pvVar22 = std::array<unsigned_int,_16UL>::operator[](pvStack_3f8,0);
      NumAccelerationStructures_1 = *pvVar22;
      pvVar22 = std::array<unsigned_int,_16UL>::operator[](pvStack_3f8,0xd);
      NumResources = *pvVar22;
      pvVar22 = std::array<unsigned_int,_16UL>::operator[](pvStack_3f8,0xf);
      msg_10.field_2._12_4_ = *pvVar22;
      msg_10.field_2._8_4_ =
           NumStorageBuffers_1 + NumUniformBuffers_1 + NumSamplers_1 + NumInputAttachments_1 +
           NumAccelerationStructures_1 + NumResources + msg_10.field_2._12_4_;
      if ((pVVar11->limits).maxPerStageResources < (uint)msg_10.field_2._8_4_) {
        FormatString<char[9],char_const*,char[17],char_const*,char[35],unsigned_int,char[32],unsigned_int,char[3]>
                  ((string *)((long)&msg_11.field_2 + 8),(Diligent *)"In PSO \'",
                   (char (*) [9])
                   &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                    .m_Desc,(char **)"\' shader stage \'",(char (*) [17])&NumStorageImages_1,
                   (char **)"\', the total number of resources (",
                   (char (*) [35])((long)&msg_10.field_2 + 8),
                   (uint *)") exceeds the per-stage limit (",
                   (char (*) [32])&(pVVar11->limits).maxPerStageResources,(uint *)0xf65ced,
                   (char (*) [3])in_stack_fffffffffffff9c8);
        pCVar17 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar17,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x47a);
        std::__cxx11::string::~string((string *)(msg_11.field_2._M_local_buf + 8));
      }
      if ((pVVar11->limits).maxPerStageDescriptorSamplers < NumAccelerationStructures_1) {
        FormatString<char[9],char_const*,char[17],char_const*,char[28],unsigned_int,char[32],unsigned_int,char[3]>
                  ((string *)((long)&msg_12.field_2 + 8),(Diligent *)"In PSO \'",
                   (char (*) [9])
                   &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                    .m_Desc,(char **)"\' shader stage \'",(char (*) [17])&NumStorageImages_1,
                   (char **)"\', the number of samplers (",
                   (char (*) [28])&NumAccelerationStructures_1,
                   (uint *)") exceeds the per-stage limit (",
                   (char (*) [32])&(pVVar11->limits).maxPerStageDescriptorSamplers,(uint *)0xf65ced,
                   (char (*) [3])in_stack_fffffffffffff9c8);
        pCVar17 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar17,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x47c);
        std::__cxx11::string::~string((string *)(msg_12.field_2._M_local_buf + 8));
      }
      if ((pVVar11->limits).maxPerStageDescriptorSampledImages < NumStorageBuffers_1) {
        FormatString<char[9],char_const*,char[17],char_const*,char[34],unsigned_int,char[32],unsigned_int,char[3]>
                  ((string *)((long)&msg_13.field_2 + 8),(Diligent *)"In PSO \'",
                   (char (*) [9])
                   &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                    .m_Desc,(char **)"\' shader stage \'",(char (*) [17])&NumStorageImages_1,
                   (char **)"\', the number of sampled images (",(char (*) [34])&NumStorageBuffers_1
                   ,(uint *)") exceeds the per-stage limit (",
                   (char (*) [32])&(pVVar11->limits).maxPerStageDescriptorSampledImages,
                   (uint *)0xf65ced,(char (*) [3])in_stack_fffffffffffff9c8);
        pCVar17 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar17,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x47e);
        std::__cxx11::string::~string((string *)(msg_13.field_2._M_local_buf + 8));
      }
      if ((pVVar11->limits).maxPerStageDescriptorStorageImages < NumUniformBuffers_1) {
        FormatString<char[9],char_const*,char[17],char_const*,char[34],unsigned_int,char[32],unsigned_int,char[3]>
                  ((string *)((long)&msg_14.field_2 + 8),(Diligent *)"In PSO \'",
                   (char (*) [9])
                   &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                    .m_Desc,(char **)"\' shader stage \'",(char (*) [17])&NumStorageImages_1,
                   (char **)"\', the number of storage images (",(char (*) [34])&NumUniformBuffers_1
                   ,(uint *)") exceeds the per-stage limit (",
                   (char (*) [32])&(pVVar11->limits).maxPerStageDescriptorStorageImages,
                   (uint *)0xf65ced,(char (*) [3])in_stack_fffffffffffff9c8);
        pCVar17 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar17,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x480);
        std::__cxx11::string::~string((string *)(msg_14.field_2._M_local_buf + 8));
      }
      if ((pVVar11->limits).maxPerStageDescriptorStorageBuffers < NumSamplers_1) {
        FormatString<char[9],char_const*,char[17],char_const*,char[35],unsigned_int,char[32],unsigned_int,char[3]>
                  ((string *)((long)&msg_15.field_2 + 8),(Diligent *)"In PSO \'",
                   (char (*) [9])
                   &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                    .m_Desc,(char **)"\' shader stage \'",(char (*) [17])&NumStorageImages_1,
                   (char **)"\', the number of storage buffers (",(char (*) [35])&NumSamplers_1,
                   (uint *)") exceeds the per-stage limit (",
                   (char (*) [32])&(pVVar11->limits).maxPerStageDescriptorStorageBuffers,
                   (uint *)0xf65ced,(char (*) [3])in_stack_fffffffffffff9c8);
        pCVar17 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar17,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x482);
        std::__cxx11::string::~string((string *)(msg_15.field_2._M_local_buf + 8));
      }
      if ((pVVar11->limits).maxPerStageDescriptorUniformBuffers < NumInputAttachments_1) {
        FormatString<char[9],char_const*,char[17],char_const*,char[35],unsigned_int,char[32],unsigned_int,char[3]>
                  ((string *)((long)&msg_16.field_2 + 8),(Diligent *)"In PSO \'",
                   (char (*) [9])
                   &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                    .m_Desc,(char **)"\' shader stage \'",(char (*) [17])&NumStorageImages_1,
                   (char **)"\', the number of uniform buffers (",
                   (char (*) [35])&NumInputAttachments_1,(uint *)") exceeds the per-stage limit (",
                   (char (*) [32])&(pVVar11->limits).maxPerStageDescriptorUniformBuffers,
                   (uint *)0xf65ced,(char (*) [3])in_stack_fffffffffffff9c8);
        pCVar17 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar17,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x484);
        std::__cxx11::string::~string((string *)(msg_16.field_2._M_local_buf + 8));
      }
      if ((pVVar11->limits).maxPerStageDescriptorInputAttachments < NumResources) {
        FormatString<char[9],char_const*,char[17],char_const*,char[37],unsigned_int,char[32],unsigned_int,char[3]>
                  ((string *)((long)&msg_17.field_2 + 8),(Diligent *)"In PSO \'",
                   (char (*) [9])
                   &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                    .m_Desc,(char **)"\' shader stage \'",(char (*) [17])&NumStorageImages_1,
                   (char **)"\', the number of input attachments (",(char (*) [37])&NumResources,
                   (uint *)") exceeds the per-stage limit (",
                   (char (*) [32])&(pVVar11->limits).maxPerStageDescriptorInputAttachments,
                   (uint *)0xf65ced,(char (*) [3])in_stack_fffffffffffff9c8);
        pCVar17 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar17,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x486);
        std::__cxx11::string::~string((string *)(msg_17.field_2._M_local_buf + 8));
      }
      if ((pEVar12->AccelStruct).maxPerStageDescriptorAccelerationStructures <
          (uint)msg_10.field_2._12_4_) {
        in_stack_fffffffffffff9c8 = (string *)local_528;
        FormatString<char[9],char_const*,char[17],char_const*,char[43],unsigned_int,char[32],unsigned_int,char[3]>
                  (in_stack_fffffffffffff9c8,(Diligent *)"In PSO \'",
                   (char (*) [9])
                   &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                    .m_Desc,(char **)"\' shader stage \'",(char (*) [17])&NumStorageImages_1,
                   (char **)"\', the number of acceleration structures (",
                   (char (*) [43])((long)&msg_10.field_2 + 0xc),
                   (uint *)") exceeds the per-stage limit (",
                   (char (*) [32])
                   &(pEVar12->AccelStruct).maxPerStageDescriptorAccelerationStructures,
                   (uint *)0xf65ced,(char (*) [3])in_stack_fffffffffffff9c8);
        pCVar17 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar17,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x488);
        std::__cxx11::string::~string((string *)local_528);
      }
    }
  }
  return;
}

Assistant:

void PipelineStateVkImpl::DvpValidateResourceLimits() const
{
    const VkPhysicalDeviceLimits&                             Limits       = GetDevice()->GetPhysicalDevice().GetProperties().limits;
    const VkPhysicalDeviceAccelerationStructurePropertiesKHR& ASLimits     = GetDevice()->GetPhysicalDevice().GetExtProperties().AccelStruct;
    const VkPhysicalDeviceDescriptorIndexingFeaturesEXT&      DescIndFeats = GetDevice()->GetPhysicalDevice().GetExtFeatures().DescriptorIndexing;
    const VkPhysicalDeviceDescriptorIndexingPropertiesEXT&    DescIndProps = GetDevice()->GetPhysicalDevice().GetExtProperties().DescriptorIndexing;
    const Uint32                                              DescCount    = static_cast<Uint32>(DescriptorType::Count);

    std::array<Uint32, DescCount>                                      DescriptorCount         = {};
    std::array<std::array<Uint32, DescCount>, MAX_SHADERS_IN_PIPELINE> PerStageDescriptorCount = {};
    std::array<bool, MAX_SHADERS_IN_PIPELINE>                          ShaderStagePresented    = {};

    for (Uint32 s = 0; s < m_SignatureCount; ++s)
    {
        const PipelineResourceSignatureVkImpl* pSignature = m_Signatures[s];
        if (pSignature == nullptr)
            continue;

        for (Uint32 r = 0; r < pSignature->GetTotalResourceCount(); ++r)
        {
            const PipelineResourceDesc&                             ResDesc   = pSignature->GetResourceDesc(r);
            const PipelineResourceSignatureVkImpl::ResourceAttribs& ResAttr   = pSignature->GetResourceAttribs(r);
            const Uint32                                            DescIndex = static_cast<Uint32>(ResAttr.DescrType);

            DescriptorCount[DescIndex] += ResAttr.ArraySize;

            for (SHADER_TYPE ShaderStages = ResDesc.ShaderStages; ShaderStages != 0;)
            {
                const Int32 ShaderInd = GetShaderTypePipelineIndex(ExtractLSB(ShaderStages), m_Desc.PipelineType);
                PerStageDescriptorCount[ShaderInd][DescIndex] += ResAttr.ArraySize;
                ShaderStagePresented[ShaderInd] = true;
            }

            if ((ResDesc.Flags & PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY) != 0)
            {
                bool NonUniformIndexingSupported = false;
                bool NonUniformIndexingIsNative  = false;
                switch (ResAttr.GetDescriptorType())
                {
                    case DescriptorType::Sampler:
                        NonUniformIndexingSupported = true;
                        NonUniformIndexingIsNative  = true;
                        break;
                    case DescriptorType::CombinedImageSampler:
                    case DescriptorType::SeparateImage:
                        NonUniformIndexingSupported = DescIndFeats.shaderSampledImageArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderSampledImageArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::StorageImage:
                        NonUniformIndexingSupported = DescIndFeats.shaderStorageImageArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderStorageImageArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::UniformTexelBuffer:
                        NonUniformIndexingSupported = DescIndFeats.shaderUniformTexelBufferArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderSampledImageArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::StorageTexelBuffer:
                    case DescriptorType::StorageTexelBuffer_ReadOnly:
                        NonUniformIndexingSupported = DescIndFeats.shaderStorageTexelBufferArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderStorageBufferArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::UniformBuffer:
                    case DescriptorType::UniformBufferDynamic:
                        NonUniformIndexingSupported = DescIndFeats.shaderUniformBufferArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderUniformBufferArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::StorageBuffer:
                    case DescriptorType::StorageBuffer_ReadOnly:
                    case DescriptorType::StorageBufferDynamic:
                    case DescriptorType::StorageBufferDynamic_ReadOnly:
                        NonUniformIndexingSupported = DescIndFeats.shaderStorageBufferArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderStorageBufferArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::InputAttachment:
                        NonUniformIndexingSupported = DescIndFeats.shaderInputAttachmentArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderInputAttachmentArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::AccelerationStructure:
                        // There is no separate feature for acceleration structures, GLSL spec says:
                        // "If GL_EXT_nonuniform_qualifier is supported
                        // When aggregated into arrays within a shader, accelerationStructureEXT can
                        // be indexed with a non-uniform integral expressions, when decorated with the
                        // nonuniformEXT qualifier."
                        // Descriptor indexing is supported here, otherwise error will be generated in ValidatePipelineResourceSignatureDesc().
                        NonUniformIndexingSupported = true;
                        NonUniformIndexingIsNative  = true;
                        break;

                    default:
                        UNEXPECTED("Unexpected descriptor type");
                }

                // TODO: We don't know if this resource is used for non-uniform indexing or not.
                if (!NonUniformIndexingSupported)
                {
                    LOG_WARNING_MESSAGE("PSO '", m_Desc.Name, "', resource signature '", pSignature->GetDesc().Name, "' contains shader resource '",
                                        ResDesc.Name, "' that is defined with RUNTIME_ARRAY flag, but current device does not support non-uniform indexing for this resource type.");
                }
                else if (!NonUniformIndexingIsNative)
                {
                    LOG_WARNING_MESSAGE("Performance warning in PSO '", m_Desc.Name, "', resource signature '", pSignature->GetDesc().Name, "': shader resource '",
                                        ResDesc.Name, "' is defined with RUNTIME_ARRAY flag, but non-uniform indexing is emulated on this device.");
                }
            }
        }
    }

    // Check total descriptor count
    {
        const Uint32 NumSampledImages =
            DescriptorCount[static_cast<Uint32>(DescriptorType::CombinedImageSampler)] +
            DescriptorCount[static_cast<Uint32>(DescriptorType::SeparateImage)] +
            DescriptorCount[static_cast<Uint32>(DescriptorType::UniformTexelBuffer)];
        const Uint32 NumStorageImages =
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageImage)] +
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageTexelBuffer)] +
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageTexelBuffer_ReadOnly)];
        const Uint32 NumStorageBuffers =
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageBuffer)] +
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageBuffer_ReadOnly)];
        const Uint32 NumDynamicStorageBuffers =
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageBufferDynamic)] +
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageBufferDynamic_ReadOnly)];
        const Uint32 NumSamplers               = DescriptorCount[static_cast<Uint32>(DescriptorType::Sampler)];
        const Uint32 NumUniformBuffers         = DescriptorCount[static_cast<Uint32>(DescriptorType::UniformBuffer)];
        const Uint32 NumDynamicUniformBuffers  = DescriptorCount[static_cast<Uint32>(DescriptorType::UniformBufferDynamic)];
        const Uint32 NumInputAttachments       = DescriptorCount[static_cast<Uint32>(DescriptorType::InputAttachment)];
        const Uint32 NumAccelerationStructures = DescriptorCount[static_cast<Uint32>(DescriptorType::AccelerationStructure)];

        DEV_CHECK_ERR(NumSamplers <= Limits.maxDescriptorSetSamplers,
                      "In PSO '", m_Desc.Name, "', the number of samplers (", NumSamplers, ") exceeds the limit (", Limits.maxDescriptorSetSamplers, ").");
        DEV_CHECK_ERR(NumSampledImages <= Limits.maxDescriptorSetSampledImages,
                      "In PSO '", m_Desc.Name, "', the number of sampled images (", NumSampledImages, ") exceeds the limit (", Limits.maxDescriptorSetSampledImages, ").");
        DEV_CHECK_ERR(NumStorageImages <= Limits.maxDescriptorSetStorageImages,
                      "In PSO '", m_Desc.Name, "', the number of storage images (", NumStorageImages, ") exceeds the limit (", Limits.maxDescriptorSetStorageImages, ").");
        DEV_CHECK_ERR(NumStorageBuffers <= Limits.maxDescriptorSetStorageBuffers,
                      "In PSO '", m_Desc.Name, "', the number of storage buffers (", NumStorageBuffers, ") exceeds the limit (", Limits.maxDescriptorSetStorageBuffers, ").");
        DEV_CHECK_ERR(NumDynamicStorageBuffers <= Limits.maxDescriptorSetStorageBuffersDynamic,
                      "In PSO '", m_Desc.Name, "', the number of dynamic storage buffers (", NumDynamicStorageBuffers, ") exceeds the limit (", Limits.maxDescriptorSetStorageBuffersDynamic, ").");
        DEV_CHECK_ERR(NumUniformBuffers <= Limits.maxDescriptorSetUniformBuffers,
                      "In PSO '", m_Desc.Name, "', the number of uniform buffers (", NumUniformBuffers, ") exceeds the limit (", Limits.maxDescriptorSetUniformBuffers, ").");
        DEV_CHECK_ERR(NumDynamicUniformBuffers <= Limits.maxDescriptorSetUniformBuffersDynamic,
                      "In PSO '", m_Desc.Name, "', the number of dynamic uniform buffers (", NumDynamicUniformBuffers, ") exceeds the limit (", Limits.maxDescriptorSetUniformBuffersDynamic, ").");
        DEV_CHECK_ERR(NumInputAttachments <= Limits.maxDescriptorSetInputAttachments,
                      "In PSO '", m_Desc.Name, "', the number of input attachments (", NumInputAttachments, ") exceeds the limit (", Limits.maxDescriptorSetInputAttachments, ").");
        DEV_CHECK_ERR(NumAccelerationStructures <= ASLimits.maxDescriptorSetAccelerationStructures,
                      "In PSO '", m_Desc.Name, "', the number of acceleration structures (", NumAccelerationStructures, ") exceeds the limit (", ASLimits.maxDescriptorSetAccelerationStructures, ").");
    }

    // Check per stage descriptor count
    for (Uint32 ShaderInd = 0; ShaderInd < PerStageDescriptorCount.size(); ++ShaderInd)
    {
        if (!ShaderStagePresented[ShaderInd])
            continue;

        const std::array<Uint32, DescCount>& NumDesc    = PerStageDescriptorCount[ShaderInd];
        const SHADER_TYPE                    ShaderType = GetShaderTypeFromPipelineIndex(ShaderInd, m_Desc.PipelineType);
        const char*                          StageName  = GetShaderTypeLiteralName(ShaderType);

        const Uint32 NumSampledImages =
            NumDesc[static_cast<Uint32>(DescriptorType::CombinedImageSampler)] +
            NumDesc[static_cast<Uint32>(DescriptorType::SeparateImage)] +
            NumDesc[static_cast<Uint32>(DescriptorType::UniformTexelBuffer)];
        const Uint32 NumStorageImages =
            NumDesc[static_cast<Uint32>(DescriptorType::StorageImage)] +
            NumDesc[static_cast<Uint32>(DescriptorType::StorageTexelBuffer)] +
            NumDesc[static_cast<Uint32>(DescriptorType::StorageTexelBuffer_ReadOnly)];
        const Uint32 NumStorageBuffers =
            NumDesc[static_cast<Uint32>(DescriptorType::StorageBuffer)] +
            NumDesc[static_cast<Uint32>(DescriptorType::StorageBuffer_ReadOnly)] +
            NumDesc[static_cast<Uint32>(DescriptorType::StorageBufferDynamic)] +
            NumDesc[static_cast<Uint32>(DescriptorType::StorageBufferDynamic_ReadOnly)];
        const Uint32 NumUniformBuffers =
            NumDesc[static_cast<Uint32>(DescriptorType::UniformBuffer)] +
            NumDesc[static_cast<Uint32>(DescriptorType::UniformBufferDynamic)];
        const Uint32 NumSamplers               = NumDesc[static_cast<Uint32>(DescriptorType::Sampler)];
        const Uint32 NumInputAttachments       = NumDesc[static_cast<Uint32>(DescriptorType::InputAttachment)];
        const Uint32 NumAccelerationStructures = NumDesc[static_cast<Uint32>(DescriptorType::AccelerationStructure)];
        const Uint32 NumResources              = NumSampledImages + NumStorageImages + NumStorageBuffers + NumUniformBuffers + NumSamplers + NumInputAttachments + NumAccelerationStructures;

        DEV_CHECK_ERR(NumResources <= Limits.maxPerStageResources,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the total number of resources (", NumResources, ") exceeds the per-stage limit (", Limits.maxPerStageResources, ").");
        DEV_CHECK_ERR(NumSamplers <= Limits.maxPerStageDescriptorSamplers,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of samplers (", NumSamplers, ") exceeds the per-stage limit (", Limits.maxPerStageDescriptorSamplers, ").");
        DEV_CHECK_ERR(NumSampledImages <= Limits.maxPerStageDescriptorSampledImages,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of sampled images (", NumSampledImages, ") exceeds the per-stage limit (", Limits.maxPerStageDescriptorSampledImages, ").");
        DEV_CHECK_ERR(NumStorageImages <= Limits.maxPerStageDescriptorStorageImages,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of storage images (", NumStorageImages, ") exceeds the per-stage limit (", Limits.maxPerStageDescriptorStorageImages, ").");
        DEV_CHECK_ERR(NumStorageBuffers <= Limits.maxPerStageDescriptorStorageBuffers,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of storage buffers (", NumStorageBuffers, ") exceeds the per-stage limit (", Limits.maxPerStageDescriptorStorageBuffers, ").");
        DEV_CHECK_ERR(NumUniformBuffers <= Limits.maxPerStageDescriptorUniformBuffers,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of uniform buffers (", NumUniformBuffers, ") exceeds the per-stage limit (", Limits.maxPerStageDescriptorUniformBuffers, ").");
        DEV_CHECK_ERR(NumInputAttachments <= Limits.maxPerStageDescriptorInputAttachments,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of input attachments (", NumInputAttachments, ") exceeds the per-stage limit (", Limits.maxPerStageDescriptorInputAttachments, ").");
        DEV_CHECK_ERR(NumAccelerationStructures <= ASLimits.maxPerStageDescriptorAccelerationStructures,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of acceleration structures (", NumAccelerationStructures, ") exceeds the per-stage limit (", ASLimits.maxPerStageDescriptorAccelerationStructures, ").");
    }
}